

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transformer.cpp
# Opt level: O1

unique_ptr<verilogAST::TernaryOp,_std::default_delete<verilogAST::TernaryOp>_> __thiscall
verilogAST::Transformer::visit
          (Transformer *this,
          unique_ptr<verilogAST::TernaryOp,_std::default_delete<verilogAST::TernaryOp>_> *node)

{
  long *plVar1;
  long *plVar2;
  long *in_RDX;
  pointer *__ptr;
  long *local_38;
  long *local_30;
  long *local_28;
  long *local_20;
  
  local_20 = *(long **)(*in_RDX + 8);
  *(undefined8 *)(*in_RDX + 8) = 0;
  (*(code *)(((node->_M_t).
              super___uniq_ptr_impl<verilogAST::TernaryOp,_std::default_delete<verilogAST::TernaryOp>_>
              ._M_t.
              super__Tuple_impl<0UL,_verilogAST::TernaryOp_*,_std::default_delete<verilogAST::TernaryOp>_>
              .super__Head_base<0UL,_verilogAST::TernaryOp_*,_false>._M_head_impl)->super_Expression
            ).super_Node)(&local_38);
  plVar2 = local_38;
  local_38 = (long *)0x0;
  plVar1 = *(long **)(*in_RDX + 8);
  *(long **)(*in_RDX + 8) = plVar2;
  if (plVar1 != (long *)0x0) {
    (**(code **)(*plVar1 + 0x10))();
  }
  if (local_38 != (long *)0x0) {
    (**(code **)(*local_38 + 0x10))();
  }
  local_38 = (long *)0x0;
  if (local_20 != (long *)0x0) {
    (**(code **)(*local_20 + 0x10))();
  }
  local_20 = (long *)0x0;
  local_28 = *(long **)(*in_RDX + 0x10);
  *(undefined8 *)(*in_RDX + 0x10) = 0;
  (*(code *)(((node->_M_t).
              super___uniq_ptr_impl<verilogAST::TernaryOp,_std::default_delete<verilogAST::TernaryOp>_>
              ._M_t.
              super__Tuple_impl<0UL,_verilogAST::TernaryOp_*,_std::default_delete<verilogAST::TernaryOp>_>
              .super__Head_base<0UL,_verilogAST::TernaryOp_*,_false>._M_head_impl)->super_Expression
            ).super_Node)(&local_38,node);
  plVar2 = local_38;
  local_38 = (long *)0x0;
  plVar1 = *(long **)(*in_RDX + 0x10);
  *(long **)(*in_RDX + 0x10) = plVar2;
  if (plVar1 != (long *)0x0) {
    (**(code **)(*plVar1 + 0x10))();
  }
  if (local_38 != (long *)0x0) {
    (**(code **)(*local_38 + 0x10))();
  }
  local_38 = (long *)0x0;
  if (local_28 != (long *)0x0) {
    (**(code **)(*local_28 + 0x10))();
  }
  local_28 = (long *)0x0;
  local_30 = *(long **)(*in_RDX + 0x18);
  *(undefined8 *)(*in_RDX + 0x18) = 0;
  (*(code *)(((node->_M_t).
              super___uniq_ptr_impl<verilogAST::TernaryOp,_std::default_delete<verilogAST::TernaryOp>_>
              ._M_t.
              super__Tuple_impl<0UL,_verilogAST::TernaryOp_*,_std::default_delete<verilogAST::TernaryOp>_>
              .super__Head_base<0UL,_verilogAST::TernaryOp_*,_false>._M_head_impl)->super_Expression
            ).super_Node)(&local_38,node);
  plVar2 = local_38;
  local_38 = (long *)0x0;
  plVar1 = *(long **)(*in_RDX + 0x18);
  *(long **)(*in_RDX + 0x18) = plVar2;
  if (plVar1 != (long *)0x0) {
    (**(code **)(*plVar1 + 0x10))();
  }
  if (local_38 != (long *)0x0) {
    (**(code **)(*local_38 + 0x10))();
  }
  local_38 = (long *)0x0;
  if (local_30 != (long *)0x0) {
    (**(code **)(*local_30 + 0x10))();
  }
  this->_vptr_Transformer = (_func_int **)*in_RDX;
  *in_RDX = 0;
  return (__uniq_ptr_data<verilogAST::TernaryOp,_std::default_delete<verilogAST::TernaryOp>,_true,_true>
          )(__uniq_ptr_data<verilogAST::TernaryOp,_std::default_delete<verilogAST::TernaryOp>,_true,_true>
            )this;
}

Assistant:

std::unique_ptr<TernaryOp> Transformer::visit(std::unique_ptr<TernaryOp> node) {
  node->cond = this->visit(std::move(node->cond));
  node->true_value = this->visit(std::move(node->true_value));
  node->false_value = this->visit(std::move(node->false_value));
  return node;
}